

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_buildSeqStore(ZSTD_CCtx *zc,void *src,size_t srcSize)

{
  BYTE **ppBVar1;
  U32 UVar2;
  ZSTD_paramSwitch_e ZVar3;
  ZSTD_compressedBlockState_t *pZVar4;
  ZSTD_matchState_t *pZVar5;
  ZSTD_compressedBlockState_t *pZVar6;
  ZSTD_sequenceProducer_F *pZVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  ZSTD_compressionParameters cParams1;
  ZSTD_compressionParameters cParams2;
  bool bVar20;
  seqStore_t *seqStore;
  size_t sVar21;
  ZSTD_blockCompressor p_Var22;
  uint uVar23;
  long lVar24;
  long lVar25;
  ZSTD_Sequence *pZVar26;
  size_t inSeqsSize;
  uint uVar27;
  uint *puVar28;
  ulong uVar29;
  seqStore_t *psVar30;
  rawSeqStore_t ldmSeqStore;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 uStack_58;
  
  if (0x20000 < srcSize) {
    __assert_fail("srcSize <= ZSTD_BLOCKSIZE_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5d07,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
  }
  uVar8 = (zc->appliedParams).cParams.windowLog;
  uVar9 = (zc->appliedParams).cParams.hashLog;
  uVar10 = (zc->appliedParams).cParams.searchLog;
  cParams1.chainLog = uVar10;
  cParams1.windowLog = uVar9;
  uVar11 = (zc->appliedParams).cParams.minMatch;
  uVar12 = (zc->appliedParams).cParams.targetLength;
  uVar13 = (zc->appliedParams).cParams.strategy;
  uVar14 = (zc->blockState).matchState.cParams.windowLog;
  uVar15 = (zc->blockState).matchState.cParams.hashLog;
  uVar16 = (zc->blockState).matchState.cParams.searchLog;
  cParams2.chainLog = uVar16;
  cParams2.windowLog = uVar15;
  uVar17 = (zc->blockState).matchState.cParams.minMatch;
  uVar18 = (zc->blockState).matchState.cParams.targetLength;
  uVar19 = (zc->blockState).matchState.cParams.strategy;
  cParams2.minMatch = uVar19;
  cParams2.searchLog = uVar18;
  cParams1.hashLog = uVar11;
  cParams1.searchLog = uVar12;
  cParams1.minMatch = uVar13;
  cParams1.targetLength = in_stack_ffffffffffffff74;
  cParams1.strategy = uVar14;
  cParams2.hashLog = uVar17;
  cParams2.targetLength = in_stack_ffffffffffffff94;
  cParams2.strategy = uVar8;
  ZSTD_assertEqualCParams(cParams1,cParams2);
  if (srcSize < 7) {
    if ((zc->appliedParams).cParams.strategy < ZSTD_btopt) {
      ZSTD_ldm_skipSequences(&zc->externSeqStore,srcSize,(zc->appliedParams).cParams.minMatch);
    }
    else {
      ZSTD_ldm_skipRawSeqStoreBytes(&zc->externSeqStore,srcSize);
    }
    return 1;
  }
  (zc->seqStore).lit = (zc->seqStore).litStart;
  (zc->seqStore).sequences = (zc->seqStore).sequencesStart;
  (zc->seqStore).longLengthType = ZSTD_llt_none;
  pZVar4 = (zc->blockState).prevCBlock;
  (zc->blockState).matchState.opt.symbolCosts = &pZVar4->entropy;
  (zc->blockState).matchState.opt.literalCompressionMode =
       (zc->appliedParams).literalCompressionMode;
  if (((zc->blockState).matchState.dictMatchState != (ZSTD_matchState_t *)0x0) &&
     ((zc->blockState).matchState.loadedDictEnd != (zc->blockState).matchState.window.dictLimit)) {
    __assert_fail("ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5d1c,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
  }
  lVar24 = (long)src - (long)(zc->blockState).matchState.window.base;
  if (0xfffffffe < lVar24) {
    __assert_fail("istart - base < (ptrdiff_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5d22,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
  }
  UVar2 = (zc->blockState).matchState.nextToUpdate;
  uVar23 = (uint)lVar24;
  if (UVar2 + 0x180 < uVar23) {
    uVar27 = (uVar23 - UVar2) - 0x180;
    if (0xbf < uVar27) {
      uVar27 = 0xc0;
    }
    (zc->blockState).matchState.nextToUpdate = uVar23 - uVar27;
  }
  psVar30 = (seqStore_t *)0x1;
  if ((zc->blockState).matchState.window.dictLimit <= (zc->blockState).matchState.window.lowLimit) {
    pZVar5 = (zc->blockState).matchState.dictMatchState;
    if (pZVar5 == (ZSTD_matchState_t *)0x0) {
      psVar30 = (seqStore_t *)0x0;
    }
    else {
      psVar30 = (seqStore_t *)(ulong)(3 - (pZVar5->dedicatedDictSearch == 0));
    }
  }
  pZVar5 = &(zc->blockState).matchState;
  seqStore = &zc->seqStore;
  pZVar6 = (zc->blockState).nextCBlock;
  lVar24 = 0;
  do {
    pZVar6->rep[lVar24] = pZVar4->rep[lVar24];
    lVar24 = lVar24 + 1;
  } while (lVar24 != 3);
  ZVar3 = (zc->appliedParams).ldmParams.enableLdm;
  if ((zc->externSeqStore).pos < (zc->externSeqStore).size) {
    if (ZVar3 != ZSTD_ps_disable) {
      __assert_fail("zc->appliedParams.ldmParams.enableLdm == ZSTD_ps_disable",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5d2f,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
    if ((zc->appliedParams).useSequenceProducer != 0) {
      return 0xffffffffffffffd7;
    }
    seqStore = (seqStore_t *)
               ZSTD_ldm_blockCompress
                         (&zc->externSeqStore,pZVar5,seqStore,((zc->blockState).nextCBlock)->rep,
                          (zc->appliedParams).useRowMatchFinder,src,srcSize);
    if ((zc->externSeqStore).size < (zc->externSeqStore).pos) {
      __assert_fail("zc->externSeqStore.pos <= zc->externSeqStore.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5d40,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
    goto LAB_001afcd3;
  }
  if (ZVar3 == ZSTD_ps_enable) {
    if ((zc->appliedParams).useSequenceProducer == 0) {
      inSeqsSize = ZSTD_ldm_generateSequences
                             (&zc->ldmState,(rawSeqStore_t *)&stack0xffffffffffffff98,
                              &(zc->appliedParams).ldmParams,src,srcSize);
      if (inSeqsSize < 0xffffffffffffff89) {
        seqStore = (seqStore_t *)
                   ZSTD_ldm_blockCompress
                             ((rawSeqStore_t *)&stack0xffffffffffffff98,pZVar5,seqStore,
                              ((zc->blockState).nextCBlock)->rep,
                              (zc->appliedParams).useRowMatchFinder,src,srcSize);
        bVar20 = true;
        goto joined_r0x001afcd1;
      }
    }
    else {
      inSeqsSize = 0xffffffffffffffd7;
      seqStore = psVar30;
    }
    bVar20 = false;
  }
  else {
    if ((zc->appliedParams).useSequenceProducer == 0) {
      p_Var22 = ZSTD_selectBlockCompressor
                          ((zc->appliedParams).cParams.strategy,
                           (zc->appliedParams).useRowMatchFinder,(ZSTD_dictMode_e)psVar30);
      (zc->blockState).matchState.ldmSeqStore = (rawSeqStore_t *)0x0;
      seqStore = (seqStore_t *)
                 (*p_Var22)(pZVar5,seqStore,((zc->blockState).nextCBlock)->rep,src,srcSize);
      goto LAB_001afcd3;
    }
    uVar29 = (zc->externalMatchCtx).seqBufferCapacity;
    if (uVar29 <= srcSize / 3) {
      __assert_fail("zc->externalMatchCtx.seqBufferCapacity >= ZSTD_sequenceBound(srcSize)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5d5d,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
    pZVar7 = (zc->externalMatchCtx).mFinder;
    if (pZVar7 == (ZSTD_sequenceProducer_F *)0x0) {
      __assert_fail("zc->externalMatchCtx.mFinder != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5d5e,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
    sVar21 = (*pZVar7)((zc->externalMatchCtx).mState,(zc->externalMatchCtx).seqBuffer,uVar29,src,
                       srcSize,(void *)0x0,0,(zc->appliedParams).compressionLevel,
                       1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f));
    uVar29 = (zc->externalMatchCtx).seqBufferCapacity;
    inSeqsSize = 0xffffffffffffff96;
    if (((sVar21 - 1 < uVar29) &&
        (pZVar26 = (zc->externalMatchCtx).seqBuffer, inSeqsSize = sVar21,
        pZVar26[sVar21 - 1].matchLength != 0 || pZVar26[sVar21 - 1].offset != 0)) &&
       (inSeqsSize = 0xffffffffffffff96, sVar21 != uVar29)) {
      pZVar26 = pZVar26 + sVar21;
      pZVar26->offset = 0;
      pZVar26->litLength = 0;
      pZVar26->matchLength = 0;
      pZVar26->rep = 0;
      inSeqsSize = sVar21 + 1;
    }
    if (inSeqsSize < 0xffffffffffffff89) {
      pZVar26 = (zc->externalMatchCtx).seqBuffer;
      if (inSeqsSize == 0) {
        uVar29 = 0;
      }
      else {
        puVar28 = &pZVar26->matchLength;
        lVar24 = 0;
        lVar25 = 0;
        uVar29 = inSeqsSize;
        do {
          lVar24 = lVar24 + (ulong)puVar28[-1];
          lVar25 = lVar25 + (ulong)*puVar28;
          puVar28 = puVar28 + 4;
          uVar29 = uVar29 - 1;
        } while (uVar29 != 0);
        uVar29 = lVar25 + lVar24;
      }
      sVar21 = 0xffffffffffffff95;
      if ((uVar29 <= srcSize) &&
         (sVar21 = ZSTD_copySequencesToSeqStoreExplicitBlockDelim
                             (zc,(ZSTD_sequencePosition *)&stack0xffffffffffffff98,pZVar26,
                              inSeqsSize,src,srcSize,(zc->appliedParams).searchForExternalRepcodes),
         sVar21 < 0xffffffffffffff89)) {
        (zc->blockState).matchState.ldmSeqStore = (rawSeqStore_t *)0x0;
        sVar21 = 0;
      }
      bVar20 = false;
      inSeqsSize = sVar21;
      seqStore = psVar30;
    }
    else if ((zc->appliedParams).enableMatchFinderFallback == 0) {
      bVar20 = false;
      seqStore = psVar30;
    }
    else {
      p_Var22 = ZSTD_selectBlockCompressor
                          ((zc->appliedParams).cParams.strategy,
                           (zc->appliedParams).useRowMatchFinder,(ZSTD_dictMode_e)psVar30);
      (zc->blockState).matchState.ldmSeqStore = (rawSeqStore_t *)0x0;
      seqStore = (seqStore_t *)
                 (*p_Var22)(pZVar5,seqStore,((zc->blockState).nextCBlock)->rep,src,srcSize);
      bVar20 = true;
    }
  }
joined_r0x001afcd1:
  if (!bVar20) {
    return inSeqsSize;
  }
LAB_001afcd3:
  memcpy((zc->seqStore).lit,(void *)((long)src + (srcSize - (long)seqStore)),(size_t)seqStore);
  ppBVar1 = &(zc->seqStore).lit;
  *ppBVar1 = *ppBVar1 + (long)seqStore;
  return 0;
}

Assistant:

static size_t ZSTD_buildSeqStore(ZSTD_CCtx* zc, const void* src, size_t srcSize)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    DEBUGLOG(5, "ZSTD_buildSeqStore (srcSize=%zu)", srcSize);
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    /* Assert that we have correctly flushed the ctx params into the ms's copy */
    ZSTD_assertEqualCParams(zc->appliedParams.cParams, ms->cParams);
    /* TODO: See 3090. We reduced MIN_CBLOCK_SIZE from 3 to 2 so to compensate we are adding
     * additional 1. We need to revisit and change this logic to be more consistent */
    if (srcSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1+1) {
        if (zc->appliedParams.cParams.strategy >= ZSTD_btopt) {
            ZSTD_ldm_skipRawSeqStoreBytes(&zc->externSeqStore, srcSize);
        } else {
            ZSTD_ldm_skipSequences(&zc->externSeqStore, srcSize, zc->appliedParams.cParams.minMatch);
        }
        return ZSTDbss_noCompress; /* don't even attempt compression below a certain srcSize */
    }
    ZSTD_resetSeqStore(&(zc->seqStore));
    /* required for optimal parser to read stats from dictionary */
    ms->opt.symbolCosts = &zc->blockState.prevCBlock->entropy;
    /* tell the optimal parser how we expect to compress literals */
    ms->opt.literalCompressionMode = zc->appliedParams.literalCompressionMode;
    /* a gap between an attached dict and the current window is not safe,
     * they must remain adjacent,
     * and when that stops being the case, the dict must be unset */
    assert(ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit);

    /* limited update after a very long match */
    {   const BYTE* const base = ms->window.base;
        const BYTE* const istart = (const BYTE*)src;
        const U32 curr = (U32)(istart-base);
        if (sizeof(ptrdiff_t)==8) assert(istart - base < (ptrdiff_t)(U32)(-1));   /* ensure no overflow */
        if (curr > ms->nextToUpdate + 384)
            ms->nextToUpdate = curr - MIN(192, (U32)(curr - ms->nextToUpdate - 384));
    }

    /* select and store sequences */
    {   ZSTD_dictMode_e const dictMode = ZSTD_matchState_dictMode(ms);
        size_t lastLLSize;
        {   int i;
            for (i = 0; i < ZSTD_REP_NUM; ++i)
                zc->blockState.nextCBlock->rep[i] = zc->blockState.prevCBlock->rep[i];
        }
        if (zc->externSeqStore.pos < zc->externSeqStore.size) {
            assert(zc->appliedParams.ldmParams.enableLdm == ZSTD_ps_disable);

            /* External matchfinder + LDM is technically possible, just not implemented yet.
             * We need to revisit soon and implement it. */
            RETURN_ERROR_IF(
                zc->appliedParams.useSequenceProducer,
                parameter_combination_unsupported,
                "Long-distance matching with external sequence producer enabled is not currently supported."
            );

            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&zc->externSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       zc->appliedParams.useRowMatchFinder,
                                       src, srcSize);
            assert(zc->externSeqStore.pos <= zc->externSeqStore.size);
        } else if (zc->appliedParams.ldmParams.enableLdm == ZSTD_ps_enable) {
            rawSeqStore_t ldmSeqStore = kNullRawSeqStore;

            /* External matchfinder + LDM is technically possible, just not implemented yet.
             * We need to revisit soon and implement it. */
            RETURN_ERROR_IF(
                zc->appliedParams.useSequenceProducer,
                parameter_combination_unsupported,
                "Long-distance matching with external sequence producer enabled is not currently supported."
            );

            ldmSeqStore.seq = zc->ldmSequences;
            ldmSeqStore.capacity = zc->maxNbLdmSequences;
            /* Updates ldmSeqStore.size */
            FORWARD_IF_ERROR(ZSTD_ldm_generateSequences(&zc->ldmState, &ldmSeqStore,
                                               &zc->appliedParams.ldmParams,
                                               src, srcSize), "");
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&ldmSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       zc->appliedParams.useRowMatchFinder,
                                       src, srcSize);
            assert(ldmSeqStore.pos == ldmSeqStore.size);
        } else if (zc->appliedParams.useSequenceProducer) {
            assert(
                zc->externalMatchCtx.seqBufferCapacity >= ZSTD_sequenceBound(srcSize)
            );
            assert(zc->externalMatchCtx.mFinder != NULL);

            {   U32 const windowSize = (U32)1 << zc->appliedParams.cParams.windowLog;

                size_t const nbExternalSeqs = (zc->externalMatchCtx.mFinder)(
                    zc->externalMatchCtx.mState,
                    zc->externalMatchCtx.seqBuffer,
                    zc->externalMatchCtx.seqBufferCapacity,
                    src, srcSize,
                    NULL, 0,  /* dict and dictSize, currently not supported */
                    zc->appliedParams.compressionLevel,
                    windowSize
                );

                size_t const nbPostProcessedSeqs = ZSTD_postProcessSequenceProducerResult(
                    zc->externalMatchCtx.seqBuffer,
                    nbExternalSeqs,
                    zc->externalMatchCtx.seqBufferCapacity,
                    srcSize
                );

                /* Return early if there is no error, since we don't need to worry about last literals */
                if (!ZSTD_isError(nbPostProcessedSeqs)) {
                    ZSTD_sequencePosition seqPos = {0,0,0};
                    size_t const seqLenSum = ZSTD_fastSequenceLengthSum(zc->externalMatchCtx.seqBuffer, nbPostProcessedSeqs);
                    RETURN_ERROR_IF(seqLenSum > srcSize, externalSequences_invalid, "External sequences imply too large a block!");
                    FORWARD_IF_ERROR(
                        ZSTD_copySequencesToSeqStoreExplicitBlockDelim(
                            zc, &seqPos,
                            zc->externalMatchCtx.seqBuffer, nbPostProcessedSeqs,
                            src, srcSize,
                            zc->appliedParams.searchForExternalRepcodes
                        ),
                        "Failed to copy external sequences to seqStore!"
                    );
                    ms->ldmSeqStore = NULL;
                    DEBUGLOG(5, "Copied %lu sequences from external sequence producer to internal seqStore.", (unsigned long)nbExternalSeqs);
                    return ZSTDbss_compress;
                }

                /* Propagate the error if fallback is disabled */
                if (!zc->appliedParams.enableMatchFinderFallback) {
                    return nbPostProcessedSeqs;
                }

                /* Fallback to software matchfinder */
                {   ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy,
                                                                                            zc->appliedParams.useRowMatchFinder,
                                                                                            dictMode);
                    ms->ldmSeqStore = NULL;
                    DEBUGLOG(
                        5,
                        "External sequence producer returned error code %lu. Falling back to internal parser.",
                        (unsigned long)nbExternalSeqs
                    );
                    lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
            }   }
        } else {   /* not long range mode and no external matchfinder */
            ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy,
                                                                                    zc->appliedParams.useRowMatchFinder,
                                                                                    dictMode);
            ms->ldmSeqStore = NULL;
            lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
        }
        {   const BYTE* const lastLiterals = (const BYTE*)src + srcSize - lastLLSize;
            ZSTD_storeLastLiterals(&zc->seqStore, lastLiterals, lastLLSize);
    }   }
    return ZSTDbss_compress;
}